

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O2

void nhdp_db_neighbor_join(nhdp_neighbor *dst,nhdp_neighbor *src)

{
  list_entity *plVar1;
  avl_node *paVar2;
  list_entity *plVar3;
  list_entity *plVar4;
  list_entity *plVar5;
  avl_node *paVar6;
  
  if (dst != src) {
    dst->symmetric = dst->symmetric + src->symmetric;
    plVar5 = (src->_links).next;
    while (plVar5->prev != (src->_links).prev) {
      plVar1 = plVar5->next;
      paVar6 = (avl_node *)plVar5[-7].next;
      while ((paVar6->list).prev != plVar5[-7].prev) {
        paVar2 = (avl_node *)(paVar6->list).next;
        avl_remove(&src->_link_addresses,paVar6);
        avl_insert(&dst->_link_addresses,paVar6);
        paVar6 = paVar2;
      }
      if ((src->originator)._type != '\0') {
        avl_remove((avl_tree *)(plVar5[-0xc].next + 0x1f),(avl_node *)(plVar5 + 1));
      }
      plVar5[3].prev = (list_entity *)dst;
      if ((dst->originator)._type != '\0') {
        avl_insert((avl_tree *)(plVar5[-0xc].next + 0x1f),(avl_node *)(plVar5 + 1));
      }
      plVar3 = plVar5->next;
      plVar4 = plVar5->prev;
      plVar4->next = plVar3;
      plVar3->prev = plVar4;
      plVar5->next = (list_entity *)0x0;
      plVar5->prev = (list_entity *)0x0;
      plVar3 = (dst->_links).prev;
      plVar5->next = &dst->_links;
      plVar5->prev = plVar3;
      (dst->_links).prev = plVar5;
      plVar3->next = plVar5;
      plVar5[-0xb].next = (list_entity *)dst;
      plVar5 = plVar1;
    }
    paVar6 = (avl_node *)(src->_neigh_addresses).list_head.next;
    while ((paVar6->list).prev != (src->_neigh_addresses).list_head.prev) {
      paVar2 = (avl_node *)(paVar6->list).next;
      avl_remove(&src->_neigh_addresses,paVar6);
      avl_insert(&dst->_neigh_addresses,paVar6);
      paVar6[-2].list.next = (list_entity *)dst;
      paVar6 = paVar2;
    }
    nhdp_db_neighbor_remove(src);
    return;
  }
  return;
}

Assistant:

void
nhdp_db_neighbor_join(struct nhdp_neighbor *dst, struct nhdp_neighbor *src) {
  struct nhdp_naddr *naddr, *na_it;
  struct nhdp_link *lnk, *l_it;
  struct nhdp_laddr *laddr, *la_it;

  if (dst == src) {
    return;
  }

  /* fix symmetric link count */
  dst->symmetric += src->symmetric;

  /* move links */
  list_for_each_element_safe(&src->_links, lnk, _neigh_node, l_it) {
    /* more addresses to new neighbor */
    avl_for_each_element_safe(&lnk->_addresses, laddr, _neigh_node, la_it) {
      avl_remove(&src->_link_addresses, &laddr->_neigh_node);
      avl_insert(&dst->_link_addresses, &laddr->_neigh_node);
    }

    /* move interface based originator */
    if (netaddr_get_address_family(&src->originator) != AF_UNSPEC) {
      avl_remove(&lnk->local_if->_link_originators, &lnk->_originator_node);
    }
    lnk->_originator_node.key = &dst->originator;
    if (netaddr_get_address_family(&dst->originator) != AF_UNSPEC) {
      avl_insert(&lnk->local_if->_link_originators, &lnk->_originator_node);
    }

    /* move link to new neighbor */
    list_remove(&lnk->_neigh_node);
    list_add_tail(&dst->_links, &lnk->_neigh_node);
    lnk->neigh = dst;
  }

  /* move neighbor addresses to target */
  avl_for_each_element_safe(&src->_neigh_addresses, naddr, _neigh_node, na_it) {
    /* move address to new neighbor */
    avl_remove(&src->_neigh_addresses, &naddr->_neigh_node);
    avl_insert(&dst->_neigh_addresses, &naddr->_neigh_node);
    naddr->neigh = dst;
  }

  nhdp_db_neighbor_remove(src);
}